

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O2

IDeckLinkDeckControlStatusCallback *
cdecklink_internal_callback_create_deck_link_deck_control_status_callback
          (void *ctx,cdecklink_deck_control_status_callback_timecode_update *cb0,
          cdecklink_deck_control_status_callback_vtr_control_state_changed *cb1,
          cdecklink_deck_control_status_callback_deck_control_event_received *cb2,
          cdecklink_deck_control_status_callback_deck_control_status_changed *cb3)

{
  undefined4 in_EAX;
  int iVar1;
  IDeckLinkDeckControlStatusCallback *pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._8_8_ = cb3;
  auVar4._0_8_ = cb2;
  auVar5._8_8_ = cb1;
  auVar5._0_8_ = cb0;
  auVar5 = auVar5 | auVar4;
  auVar3._0_4_ = -(uint)(auVar5._0_4_ == 0);
  auVar3._4_4_ = -(uint)(auVar5._4_4_ == 0);
  auVar3._8_4_ = -(uint)(auVar5._8_4_ == 0);
  auVar3._12_4_ = -(uint)(auVar5._12_4_ == 0);
  iVar1 = movmskps(in_EAX,auVar3);
  if (iVar1 != 0xf) {
    pIVar2 = (IDeckLinkDeckControlStatusCallback *)operator_new(0x38);
    (pIVar2->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108a20;
    *(undefined4 *)&pIVar2[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar2[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar2[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    pIVar2[4].super_IUnknown._vptr_IUnknown = (_func_int **)cb1;
    pIVar2[5].super_IUnknown._vptr_IUnknown = (_func_int **)cb2;
    pIVar2[6].super_IUnknown._vptr_IUnknown = (_func_int **)cb3;
    return pIVar2;
  }
  return (IDeckLinkDeckControlStatusCallback *)0x0;
}

Assistant:

IDeckLinkDeckControlStatusCallback* cdecklink_internal_callback_create_deck_link_deck_control_status_callback (void *ctx, cdecklink_deck_control_status_callback_timecode_update *cb0, cdecklink_deck_control_status_callback_vtr_control_state_changed *cb1, cdecklink_deck_control_status_callback_deck_control_event_received *cb2, cdecklink_deck_control_status_callback_deck_control_status_changed *cb3) {
	if (cb0 != nullptr || cb1 != nullptr || cb2 != nullptr || cb3 != nullptr) {
		return new DeckLinkDeckControlStatusCallback(ctx, cb0, cb1, cb2, cb3);
	}
	return nullptr;
}